

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

uchar * entry_to_rgba(anm_entry_t *entry,int is_png)

{
  undefined1 local_38 [8];
  image_t image;
  int is_png_local;
  anm_entry_t *entry_local;
  
  image._20_4_ = is_png;
  if (is_png == 0) {
    entry_local = (anm_entry_t *)
                  format_to_rgba(entry->data,(uint)entry->thtx->w * (uint)entry->thtx->h,
                                 (uint)entry->thtx->format);
  }
  else {
    png_read_mem((image_t *)local_38,entry->data,(ulong)entry->thtx->size);
    entry_local = (anm_entry_t *)local_38;
  }
  return (uchar *)entry_local;
}

Assistant:

static unsigned char *
entry_to_rgba(
    anm_entry_t *entry,
    int is_png)
{
    if (is_png) {
        image_t image;
        png_read_mem(&image, entry->data, entry->thtx->size);
        return image.data;
    } else {
        return format_to_rgba(entry->data, entry->thtx->w * entry->thtx->h, entry->thtx->format);
    }
}